

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_auth_client.c
# Opt level: O0

IOTHUB_SECURITY_HANDLE iothub_device_auth_create(void)

{
  HSM_CLIENT_CREATE p_Var1;
  HSM_CLIENT_DESTROY p_Var2;
  HSM_CLIENT_SIGN_WITH_IDENTITY p_Var3;
  HSM_CLIENT_GET_CERTIFICATE p_Var4;
  HSM_CLIENT_GET_ALIAS_KEY p_Var5;
  HSM_CLIENT_GET_SYMMETRICAL_KEY p_Var6;
  HSM_CLIENT_SET_SYMMETRICAL_KEY_INFO p_Var7;
  IOTHUB_SECURITY_TYPE IVar8;
  int iVar9;
  LOGGER_LOG p_Var10;
  HSM_CLIENT_TPM_INTERFACE *pHVar11;
  HSM_CLIENT_X509_INTERFACE *pHVar12;
  HSM_CLIENT_KEY_INTERFACE *pHVar13;
  HSM_CLIENT_HANDLE pvVar14;
  char *pcVar15;
  char *pcVar16;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  HSM_CLIENT_KEY_INTERFACE *key_interface;
  LOGGER_LOG l_2;
  HSM_CLIENT_X509_INTERFACE *x509_interface;
  LOGGER_LOG l_1;
  HSM_CLIENT_TPM_INTERFACE *tpm_interface;
  LOGGER_LOG l;
  IOTHUB_SECURITY_HANDLE pIStack_10;
  IOTHUB_SECURITY_TYPE iothub_security_t;
  IOTHUB_SECURITY_INFO *result;
  
  IVar8 = iothub_security_type();
  pIStack_10 = (IOTHUB_SECURITY_HANDLE)malloc(0x70);
  if (pIStack_10 == (IOTHUB_SECURITY_HANDLE)0x0) {
    p_Var10 = xlogging_get_log_function();
    if (p_Var10 != (LOGGER_LOG)0x0) {
      (*p_Var10)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                 ,"iothub_device_auth_create",0x82,1,"Failed allocating IOTHUB_SECURITY_INFO.");
    }
  }
  else {
    memset(pIStack_10,0,0x70);
    if (IVar8 == IOTHUB_SECURITY_TYPE_SAS) {
      pIStack_10->cred_type = AUTH_TYPE_SAS;
      pIStack_10->base64_encode_signature = true;
      pIStack_10->urlencode_token_scope = false;
      pHVar11 = hsm_client_tpm_interface();
      if ((((pHVar11 == (HSM_CLIENT_TPM_INTERFACE *)0x0) ||
           (p_Var1 = pHVar11->hsm_client_tpm_create, pIStack_10->hsm_client_create = p_Var1,
           p_Var1 == (HSM_CLIENT_CREATE)0x0)) ||
          (p_Var2 = pHVar11->hsm_client_tpm_destroy, pIStack_10->hsm_client_destroy = p_Var2,
          p_Var2 == (HSM_CLIENT_DESTROY)0x0)) ||
         (p_Var3 = pHVar11->hsm_client_sign_with_identity, pIStack_10->hsm_client_sign_data = p_Var3
         , p_Var3 == (HSM_CLIENT_SIGN_WITH_IDENTITY)0x0)) {
        p_Var10 = xlogging_get_log_function();
        if (p_Var10 != (LOGGER_LOG)0x0) {
          (*p_Var10)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                     ,"iothub_device_auth_create",0x94,1,"Invalid secure device interface");
        }
        free(pIStack_10);
        pIStack_10 = (IOTHUB_SECURITY_HANDLE)0x0;
      }
    }
    if ((pIStack_10 != (IOTHUB_SECURITY_HANDLE)0x0) && (IVar8 == IOTHUB_SECURITY_TYPE_X509)) {
      pIStack_10->cred_type = AUTH_TYPE_X509;
      pIStack_10->base64_encode_signature = true;
      pIStack_10->urlencode_token_scope = false;
      pHVar12 = hsm_client_x509_interface();
      if (((pHVar12 == (HSM_CLIENT_X509_INTERFACE *)0x0) ||
          ((p_Var1 = pHVar12->hsm_client_x509_create, pIStack_10->hsm_client_create = p_Var1,
           p_Var1 == (HSM_CLIENT_CREATE)0x0 ||
           (p_Var2 = pHVar12->hsm_client_x509_destroy, pIStack_10->hsm_client_destroy = p_Var2,
           p_Var2 == (HSM_CLIENT_DESTROY)0x0)))) ||
         ((p_Var4 = pHVar12->hsm_client_get_cert, pIStack_10->hsm_client_get_cert = p_Var4,
          p_Var4 == (HSM_CLIENT_GET_CERTIFICATE)0x0 ||
          (p_Var5 = pHVar12->hsm_client_get_key, pIStack_10->hsm_client_get_alias_key = p_Var5,
          p_Var5 == (HSM_CLIENT_GET_ALIAS_KEY)0x0)))) {
        p_Var10 = xlogging_get_log_function();
        if (p_Var10 != (LOGGER_LOG)0x0) {
          (*p_Var10)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                     ,"iothub_device_auth_create",0xa8,1,
                     "Invalid handle parameter: DEVICE_AUTH_CREATION_INFO is NULL");
        }
        free(pIStack_10);
        pIStack_10 = (IOTHUB_SECURITY_HANDLE)0x0;
      }
    }
    if ((pIStack_10 != (IOTHUB_SECURITY_HANDLE)0x0) && (IVar8 == IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY)
       ) {
      pIStack_10->cred_type = AUTH_TYPE_SYMM_KEY;
      pIStack_10->base64_encode_signature = true;
      pIStack_10->urlencode_token_scope = false;
      pHVar13 = hsm_client_key_interface();
      if (((pHVar13 == (HSM_CLIENT_KEY_INTERFACE *)0x0) ||
          (((p_Var1 = pHVar13->hsm_client_key_create, pIStack_10->hsm_client_create = p_Var1,
            p_Var1 == (HSM_CLIENT_CREATE)0x0 ||
            (p_Var2 = pHVar13->hsm_client_key_destroy, pIStack_10->hsm_client_destroy = p_Var2,
            p_Var2 == (HSM_CLIENT_DESTROY)0x0)) ||
           (p_Var6 = pHVar13->hsm_client_get_symm_key, pIStack_10->hsm_client_get_symm_key = p_Var6,
           p_Var6 == (HSM_CLIENT_GET_SYMMETRICAL_KEY)0x0)))) ||
         (p_Var7 = pHVar13->hsm_client_set_symm_key_info,
         pIStack_10->hsm_client_set_symm_key_info = p_Var7,
         p_Var7 == (HSM_CLIENT_SET_SYMMETRICAL_KEY_INFO)0x0)) {
        p_Var10 = xlogging_get_log_function();
        if (p_Var10 != (LOGGER_LOG)0x0) {
          (*p_Var10)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                     ,"iothub_device_auth_create",0xbc,1,
                     "Invalid x509 secure device interface was specified");
        }
        free(pIStack_10);
        pIStack_10 = (IOTHUB_SECURITY_HANDLE)0x0;
      }
    }
    if (pIStack_10 == (IOTHUB_SECURITY_HANDLE)0x0) {
      p_Var10 = xlogging_get_log_function();
      if (p_Var10 != (LOGGER_LOG)0x0) {
        (*p_Var10)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                   ,"iothub_device_auth_create",0xd8,1,
                   "Error allocating result or else unsupported security type %d",IVar8);
      }
    }
    else if (pIStack_10->hsm_client_create == (HSM_CLIENT_CREATE)0x0) {
      p_Var10 = xlogging_get_log_function();
      if (p_Var10 != (LOGGER_LOG)0x0) {
        (*p_Var10)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                   ,"iothub_device_auth_create",0xdc,1,"hsm_client_create is not a valid address");
      }
      free(pIStack_10);
      pIStack_10 = (IOTHUB_SECURITY_HANDLE)0x0;
    }
    else {
      pvVar14 = (*pIStack_10->hsm_client_create)();
      pIStack_10->hsm_client_handle = pvVar14;
      if (pvVar14 == (HSM_CLIENT_HANDLE)0x0) {
        p_Var10 = xlogging_get_log_function();
        if (p_Var10 != (LOGGER_LOG)0x0) {
          (*p_Var10)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                     ,"iothub_device_auth_create",0xe4,1,"failed create device auth module.");
        }
        free(pIStack_10);
        pIStack_10 = (IOTHUB_SECURITY_HANDLE)0x0;
      }
      else if (pIStack_10->cred_type == AUTH_TYPE_SYMM_KEY) {
        p_Var7 = pIStack_10->hsm_client_set_symm_key_info;
        pvVar14 = pIStack_10->hsm_client_handle;
        pcVar15 = iothub_security_get_symm_registration_name();
        pcVar16 = iothub_security_get_symmetric_key();
        iVar9 = (*p_Var7)(pvVar14,pcVar15,pcVar16);
        if (iVar9 != 0) {
          p_Var10 = xlogging_get_log_function();
          if (p_Var10 != (LOGGER_LOG)0x0) {
            (*p_Var10)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                       ,"iothub_device_auth_create",0xea,1,
                       "Invalid x509 secure device interface was specified");
          }
          (*pIStack_10->hsm_client_destroy)(pIStack_10->hsm_client_handle);
          free(pIStack_10);
          pIStack_10 = (IOTHUB_SECURITY_HANDLE)0x0;
        }
      }
    }
  }
  return pIStack_10;
}

Assistant:

IOTHUB_SECURITY_HANDLE iothub_device_auth_create()
{
    IOTHUB_SECURITY_INFO* result;

    IOTHUB_SECURITY_TYPE iothub_security_t = iothub_security_type();

    if ((result = (IOTHUB_SECURITY_INFO*)malloc(sizeof(IOTHUB_SECURITY_INFO))) == NULL)
    {
        LogError("Failed allocating IOTHUB_SECURITY_INFO.");
    }
    else
    {
        memset(result, 0, sizeof(IOTHUB_SECURITY_INFO) );
#if defined(HSM_TYPE_SAS_TOKEN)  || defined(HSM_AUTH_TYPE_CUSTOM)
        if (iothub_security_t == IOTHUB_SECURITY_TYPE_SAS)
        {
            result->cred_type = AUTH_TYPE_SAS;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_TPM_INTERFACE* tpm_interface = hsm_client_tpm_interface();
            if ((tpm_interface == NULL) ||
                ((result->hsm_client_create = tpm_interface->hsm_client_tpm_create) == NULL) ||
                ((result->hsm_client_destroy = tpm_interface->hsm_client_tpm_destroy) == NULL) ||
                ((result->hsm_client_sign_data = tpm_interface->hsm_client_sign_with_identity) == NULL)
                )
            {
                LogError("Invalid secure device interface");
                free(result);
                result = NULL;
            }
        }
#endif
#if defined(HSM_TYPE_X509) || defined(HSM_TYPE_RIOT) || defined(HSM_AUTH_TYPE_CUSTOM)
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_X509)
        {
            result->cred_type = AUTH_TYPE_X509;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_X509_INTERFACE* x509_interface = hsm_client_x509_interface();
            if ((x509_interface == NULL) ||
                ((result->hsm_client_create = x509_interface->hsm_client_x509_create) == NULL) ||
                ((result->hsm_client_destroy = x509_interface->hsm_client_x509_destroy) == NULL) ||
                ((result->hsm_client_get_cert = x509_interface->hsm_client_get_cert) == NULL) ||
                ((result->hsm_client_get_alias_key = x509_interface->hsm_client_get_key) == NULL)
                )
            {
                LogError("Invalid handle parameter: DEVICE_AUTH_CREATION_INFO is NULL");
                free(result);
                result = NULL;
            }
        }
#endif
#if defined(HSM_TYPE_SYMM_KEY) || defined(HSM_AUTH_TYPE_CUSTOM)
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY)
        {
            result->cred_type = AUTH_TYPE_SYMM_KEY;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_KEY_INTERFACE* key_interface = hsm_client_key_interface();
            if ((key_interface == NULL) ||
                ((result->hsm_client_create = key_interface->hsm_client_key_create) == NULL) ||
                ((result->hsm_client_destroy = key_interface->hsm_client_key_destroy) == NULL) ||
                ((result->hsm_client_get_symm_key = key_interface->hsm_client_get_symm_key) == NULL) ||
                ((result->hsm_client_set_symm_key_info = key_interface->hsm_client_set_symm_key_info) == NULL)
                )
            {
                LogError("Invalid x509 secure device interface was specified");
                free(result);
                result = NULL;
            }
        }
#endif
#ifdef HSM_TYPE_HTTP_EDGE
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_HTTP_EDGE)
        {
            result->cred_type = AUTH_TYPE_SAS;
            // Because HTTP_edge operates over HTTP, the server has already base64 encoded signature its returning to us.
            result->base64_encode_signature = false;
            result->urlencode_token_scope = true;
            const HSM_CLIENT_HTTP_EDGE_INTERFACE* http_edge_interface = hsm_client_http_edge_interface();
            if ((http_edge_interface == NULL) ||
                ((result->hsm_client_create = http_edge_interface->hsm_client_http_edge_create) == NULL) ||
                ((result->hsm_client_destroy = http_edge_interface->hsm_client_http_edge_destroy) == NULL) ||
                ((result->hsm_client_sign_data = http_edge_interface->hsm_client_sign_with_identity) == NULL) ||
                ((result->hsm_client_get_trust_bundle = http_edge_interface->hsm_client_get_trust_bundle) == NULL))
            {
                LogError("Invalid secure device interface");
                free(result);
                result = NULL;
            }
        }
#endif
        if (result == NULL)
        {
            LogError("Error allocating result or else unsupported security type %d", iothub_security_t);
        }
        else if (result->hsm_client_create == NULL)
        {
            LogError("hsm_client_create is not a valid address");
            free(result);
            result = NULL;
        }
        else
        {
            if ((result->hsm_client_handle = result->hsm_client_create()) == NULL)
            {
                LogError("failed create device auth module.");
                free(result);
                result = NULL;
            }
            else if (result->cred_type == AUTH_TYPE_SYMM_KEY && result->hsm_client_set_symm_key_info(result->hsm_client_handle, iothub_security_get_symm_registration_name(), iothub_security_get_symmetric_key()) != 0)
            {
                LogError("Invalid x509 secure device interface was specified");
                result->hsm_client_destroy(result->hsm_client_handle);
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}